

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDupTransformMiter(Abc_Ntk_t *pNtk)

{
  Abc_Aig_t *pAVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  int local_34;
  int i;
  Abc_Obj_t *pMiter;
  Abc_Obj_t *pObj2;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsStrash(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x26b,"Abc_Ntk_t *Abc_NtkDupTransformMiter(Abc_Ntk_t *)");
  }
  pNtk_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
  pNtk_00->nConstrs = pNtk->nConstrs;
  pNtk_00->nBarBufs = pNtk->nBarBufs;
  pcVar4 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar4;
  pcVar4 = Extra_UtilStrsav(pNtk->pSpec);
  pNtk_00->pSpec = pcVar4;
  Abc_NtkCleanCopy(pNtk);
  pAVar5 = Abc_AigConst1(pNtk_00);
  pAVar6 = Abc_AigConst1(pNtk);
  (pAVar6->field_6).pCopy = pAVar5;
  for (local_34 = 0; iVar2 = Abc_NtkPiNum(pNtk), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar5 = Abc_NtkPi(pNtk,local_34);
    Abc_NtkDupObj(pNtk_00,pAVar5,1);
  }
  for (local_34 = 0; iVar2 = Abc_NtkPoNum(pNtk), local_34 < iVar2; local_34 = local_34 + 2) {
    pAVar5 = Abc_NtkPo(pNtk,local_34);
    Abc_NtkDupObj(pNtk_00,pAVar5,1);
  }
  for (local_34 = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar5 = Abc_NtkBox(pNtk,local_34);
    Abc_NtkDupBox(pNtk_00,pAVar5,1);
  }
  for (local_34 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar5 = Abc_NtkObj(pNtk,local_34);
    if ((pAVar5 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_AigNodeIsAnd(pAVar5), iVar2 != 0)) {
      pAVar1 = (Abc_Aig_t *)pNtk_00->pManFunc;
      pAVar6 = Abc_ObjChild0Copy(pAVar5);
      pAVar7 = Abc_ObjChild1Copy(pAVar5);
      pAVar6 = Abc_AigAnd(pAVar1,pAVar6,pAVar7);
      (pAVar5->field_6).pCopy = pAVar6;
    }
  }
  for (local_34 = 0; iVar2 = Abc_NtkPoNum(pNtk), local_34 < iVar2; local_34 = local_34 + 2) {
    pAVar5 = Abc_NtkPo(pNtk,local_34);
    pAVar6 = Abc_NtkPo(pNtk,local_34 + 1);
    pAVar1 = (Abc_Aig_t *)pNtk_00->pManFunc;
    pAVar7 = Abc_ObjChild0Copy(pAVar5);
    pAVar6 = Abc_ObjChild0Copy(pAVar6);
    pAVar6 = Abc_AigXor(pAVar1,pAVar7,pAVar6);
    Abc_ObjAddFanin((pAVar5->field_6).pCopy,pAVar6);
  }
  for (local_34 = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar5 = Abc_NtkBox(pNtk,local_34);
    iVar2 = Abc_ObjIsLatch(pAVar5);
    if (iVar2 != 0) {
      pAVar5 = Abc_NtkBox(pNtk,local_34);
      pAVar6 = Abc_ObjFanin0(pAVar5);
      pAVar5 = (pAVar6->field_6).pCopy;
      pAVar6 = Abc_ObjChild0Copy(pAVar6);
      Abc_ObjAddFanin(pAVar5,pAVar6);
    }
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc);
  iVar2 = Abc_NtkPiNum(pNtk);
  iVar3 = Abc_NtkPiNum(pNtk_00);
  if (iVar2 != iVar3) {
    __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x28d,"Abc_Ntk_t *Abc_NtkDupTransformMiter(Abc_Ntk_t *)");
  }
  iVar2 = Abc_NtkPoNum(pNtk);
  iVar3 = Abc_NtkPoNum(pNtk_00);
  if (iVar2 != iVar3 * 2) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 2*Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x28e,"Abc_Ntk_t *Abc_NtkDupTransformMiter(Abc_Ntk_t *)");
  }
  iVar2 = Abc_NtkLatchNum(pNtk);
  iVar3 = Abc_NtkLatchNum(pNtk_00);
  if (iVar2 != iVar3) {
    __assert_fail("Abc_NtkLatchNum(pNtk) == Abc_NtkLatchNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x28f,"Abc_Ntk_t *Abc_NtkDupTransformMiter(Abc_Ntk_t *)");
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkDupTransformMiter( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pObj2, * pMiter;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    pNtkNew->nConstrs   = pNtk->nConstrs;
    pNtkNew->nBarBufs   = pNtk->nBarBufs;
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
     Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 ), i++;
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, 1 );
    // copy the AND gates
    Abc_AigForEachAnd( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // create new miters
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pObj2 = Abc_NtkPo( pNtk, ++i );
        pMiter = Abc_AigXor( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild0Copy(pObj2) );
        Abc_ObjAddFanin( pObj->pCopy, pMiter );
    }
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
        Abc_ObjAddFanin( pObj->pCopy, Abc_ObjChild0Copy(pObj) );
    // cleanup
    Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );
    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtk) == 2*Abc_NtkPoNum(pNtkNew) );
    assert( Abc_NtkLatchNum(pNtk) == Abc_NtkLatchNum(pNtkNew) );
    return pNtkNew;
}